

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::FramebufferDefaultStateQueryTests::init
          (FramebufferDefaultStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  QueryType QVar2;
  TestNode *pTVar3;
  char *pcVar4;
  FramebufferDefaultStateQueryTests *pFVar5;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  QueryType local_144;
  char *pcStack_140;
  QueryType verifier_3;
  char *verifierSuffix_3;
  int verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  QueryType local_ec;
  char *pcStack_e8;
  QueryType verifier_2;
  char *verifierSuffix_2;
  int verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  QueryType local_94;
  char *pcStack_90;
  QueryType verifier_1;
  char *verifierSuffix_1;
  undefined1 local_7d;
  int verifierNdx_1;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  QueryType local_24;
  char *pcStack_20;
  QueryType verifier;
  char *verifierSuffix;
  FramebufferDefaultStateQueryTests *pFStack_10;
  int verifierNdx;
  FramebufferDefaultStateQueryTests *this_local;
  
  verifierSuffix._4_4_ = 0;
  pFVar5 = this;
  pFStack_10 = this;
  while ((int)verifierSuffix._4_4_ < 1) {
    pcStack_20 = anon_unknown_1::getVerifierSuffix(init::verifiers[(int)verifierSuffix._4_4_]);
    local_24 = init::verifiers[(int)verifierSuffix._4_4_];
    pTVar3 = (TestNode *)operator_new(0x80);
    QVar2 = local_24;
    local_7d = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"framebuffer_default_width_",&local_69);
    std::operator+(&local_48,&local_68,pcStack_20);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::FramebufferDimensionTest::FramebufferDimensionTest
              ((FramebufferDimensionTest *)pTVar3,pCVar1,QVar2,DIMENSION_WIDTH,pcVar4,
               "Test FRAMEBUFFER_DEFAULT_WIDTH");
    local_7d = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    verifierSuffix._4_4_ = verifierSuffix._4_4_ + 1;
    pFVar5 = (FramebufferDefaultStateQueryTests *)(ulong)verifierSuffix._4_4_;
  }
  verifierSuffix_1._4_4_ = 0;
  while ((int)verifierSuffix_1._4_4_ < 1) {
    pcStack_90 = anon_unknown_1::getVerifierSuffix(init::verifiers[(int)verifierSuffix_1._4_4_]);
    local_94 = init::verifiers[(int)verifierSuffix_1._4_4_];
    pTVar3 = (TestNode *)operator_new(0x80);
    QVar2 = local_94;
    verifierSuffix_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verifierNdx_2,"framebuffer_default_height_",
               (allocator<char> *)((long)&verifierSuffix_2 + 7));
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_2,pcStack_90);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::FramebufferDimensionTest::FramebufferDimensionTest
              ((FramebufferDimensionTest *)pTVar3,pCVar1,QVar2,DIMENSION_HEIGHT,pcVar4,
               "Test FRAMEBUFFER_DEFAULT_HEIGHT");
    verifierSuffix_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_2 + 7));
    verifierSuffix_1._4_4_ = verifierSuffix_1._4_4_ + 1;
    pFVar5 = (FramebufferDefaultStateQueryTests *)(ulong)verifierSuffix_1._4_4_;
  }
  verifierSuffix_2._0_4_ = 0;
  while ((int)(uint)verifierSuffix_2 < 1) {
    pcStack_e8 = anon_unknown_1::getVerifierSuffix(init::verifiers[(int)(uint)verifierSuffix_2]);
    local_ec = init::verifiers[(int)(uint)verifierSuffix_2];
    pTVar3 = (TestNode *)operator_new(0x80);
    QVar2 = local_ec;
    verifierSuffix_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verifierNdx_3,"framebuffer_default_samples_",
               (allocator<char> *)((long)&verifierSuffix_3 + 7));
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_3,pcStack_e8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::FramebufferSamplesTest::FramebufferSamplesTest
              ((FramebufferSamplesTest *)pTVar3,pCVar1,QVar2,pcVar4,
               "Test FRAMEBUFFER_DEFAULT_SAMPLES");
    verifierSuffix_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_3 + 7));
    verifierSuffix_2._0_4_ = (uint)verifierSuffix_2 + 1;
    pFVar5 = (FramebufferDefaultStateQueryTests *)(ulong)(uint)verifierSuffix_2;
  }
  verifierSuffix_3._0_4_ = 0;
  while ((int)(uint)verifierSuffix_3 < 1) {
    pcStack_140 = anon_unknown_1::getVerifierSuffix(init::verifiers[(int)(uint)verifierSuffix_3]);
    local_144 = init::verifiers[(int)(uint)verifierSuffix_3];
    pTVar3 = (TestNode *)operator_new(0x80);
    QVar2 = local_144;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"framebuffer_default_fixed_sample_locations_",&local_189);
    std::operator+(&local_168,&local_188,pcStack_140);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::FramebufferFixedSampleLocationsTest::FramebufferFixedSampleLocationsTest
              ((FramebufferFixedSampleLocationsTest *)pTVar3,pCVar1,QVar2,pcVar4,
               "Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS");
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    verifierSuffix_3._0_4_ = (uint)verifierSuffix_3 + 1;
    pFVar5 = (FramebufferDefaultStateQueryTests *)(ulong)(uint)verifierSuffix_3;
  }
  return (int)pFVar5;
}

Assistant:

void FramebufferDefaultStateQueryTests::init (void)
{
	static const QueryType verifiers[] =
	{
		QUERY_FRAMEBUFFER_INTEGER,
	};

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix(verifiers[verifierNdx]);				\
		const QueryType verifier = verifiers[verifierNdx];								\
		this->addChild(X);																	\
	}

	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_WIDTH,	(std::string("framebuffer_default_width_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_WIDTH"));
	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_HEIGHT,	(std::string("framebuffer_default_height_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_HEIGHT"));
	FOR_EACH_VERIFIER(new FramebufferSamplesTest				(m_context, verifier,												(std::string("framebuffer_default_samples_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_SAMPLES"));
	FOR_EACH_VERIFIER(new FramebufferFixedSampleLocationsTest	(m_context, verifier,												(std::string("framebuffer_default_fixed_sample_locations_") + verifierSuffix).c_str(),	"Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS"));

#undef FOR_EACH_VERIFIER
}